

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<4,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  Geometry *pGVar8;
  RTCIntersectArguments *pRVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  byte bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar29;
  AABBNodeMB4D *node1;
  ulong uVar30;
  uint uVar31;
  float *vertices_2;
  byte bVar33;
  byte bVar34;
  uint uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  ulong uVar46;
  long lVar47;
  ulong uVar48;
  ulong uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar59;
  StackItemT<embree::NodeRefPtr<4>_> SVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined4 uVar89;
  undefined1 auVar90 [16];
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar112 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  UVIdentity<4> mapUV;
  int local_118c;
  undefined1 local_1188 [16];
  undefined1 local_1178 [16];
  long local_1168;
  long local_1160;
  StackItemT<embree::NodeRefPtr<4>_> *local_1158;
  long local_1150;
  long local_1148;
  Scene *local_1140;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  vfloat<4> tNear;
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008 [4];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar32;
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    local_1158 = stack + 1;
    stack[0].dist = 0;
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar50 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
    auVar117 = ZEXT1664(auVar50);
    auVar51 = vmaxss_avx512f(auVar50,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    fVar102 = (ray->super_RayK<1>).tfar;
    auVar88 = ZEXT464((uint)fVar102);
    auVar52._8_4_ = 0x7fffffff;
    auVar52._0_8_ = 0x7fffffff7fffffff;
    auVar52._12_4_ = 0x7fffffff;
    auVar52 = vandps_avx512vl((undefined1  [16])aVar3,auVar52);
    auVar53._8_4_ = 0x219392ef;
    auVar53._0_8_ = 0x219392ef219392ef;
    auVar53._12_4_ = 0x219392ef;
    uVar49 = vcmpps_avx512vl(auVar52,auVar53,1);
    auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar118 = ZEXT1664(auVar52);
    auVar52 = vdivps_avx512vl(auVar52,(undefined1  [16])aVar3);
    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar10 = (bool)((byte)uVar49 & 1);
    auVar56._0_4_ = (uint)bVar10 * auVar53._0_4_ | (uint)!bVar10 * auVar52._0_4_;
    bVar10 = (bool)((byte)(uVar49 >> 1) & 1);
    auVar56._4_4_ = (uint)bVar10 * auVar53._4_4_ | (uint)!bVar10 * auVar52._4_4_;
    bVar10 = (bool)((byte)(uVar49 >> 2) & 1);
    auVar56._8_4_ = (uint)bVar10 * auVar53._8_4_ | (uint)!bVar10 * auVar52._8_4_;
    bVar10 = (bool)((byte)(uVar49 >> 3) & 1);
    auVar56._12_4_ = (uint)bVar10 * auVar53._12_4_ | (uint)!bVar10 * auVar52._12_4_;
    auVar54._8_4_ = 0x3f7ffffa;
    auVar54._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar54._12_4_ = 0x3f7ffffa;
    vmulps_avx512vl(auVar56,auVar54);
    auVar55._8_4_ = 0x3f800003;
    auVar55._0_8_ = 0x3f8000033f800003;
    auVar55._12_4_ = 0x3f800003;
    auVar53 = vmulps_avx512vl(auVar56,auVar55);
    auVar54 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar55 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar56 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar57 = vmaxss_avx512f(auVar50,ZEXT416((uint)fVar102));
    auVar52 = vucomiss_avx512f(auVar50);
    fVar91 = auVar52._0_4_;
    vmovshdup_avx(auVar52);
    local_fa8 = vshufps_avx(auVar52,auVar52,0x55);
    auVar107 = ZEXT1664(local_fa8);
    vshufpd_avx(auVar52,auVar52,1);
    local_fb8 = vshufps_avx(auVar52,auVar52,0xaa);
    auVar108 = ZEXT1664(local_fb8);
    fVar81 = auVar53._0_4_;
    local_fd8 = vshufps_avx(auVar53,auVar53,0x55);
    auVar112 = ZEXT1664(local_fd8);
    local_fe8 = vshufps_avx(auVar53,auVar53,0xaa);
    auVar114 = ZEXT1664(local_fe8);
    lVar45 = 0;
    vucomiss_avx512f(auVar50);
    lVar47 = 0x20;
    vucomiss_avx512f(auVar50);
    uVar89 = auVar51._0_4_;
    local_ff8._4_4_ = uVar89;
    local_ff8._0_4_ = uVar89;
    local_ff8._8_4_ = uVar89;
    local_ff8._12_4_ = uVar89;
    auVar116 = ZEXT1664(local_ff8);
    uVar89 = auVar57._0_4_;
    auVar87 = ZEXT1664(CONCAT412(uVar89,CONCAT48(uVar89,CONCAT44(uVar89,uVar89))));
    local_1160 = 0;
    local_f98 = fVar91;
    fStack_f94 = fVar91;
    fStack_f90 = fVar91;
    fStack_f8c = fVar91;
    local_fc8 = fVar81;
    fStack_fc4 = fVar81;
    fStack_fc0 = fVar81;
    fStack_fbc = fVar81;
    local_1168 = 0x20;
    fVar102 = fVar91;
    fVar103 = fVar91;
    fVar104 = fVar91;
    fVar109 = fVar81;
    fVar110 = fVar81;
    fVar111 = fVar81;
LAB_01bdb380:
    if (local_1158 != stack) {
      pSVar29 = local_1158 + -1;
      local_1158 = local_1158 + -1;
      if ((float)pSVar29->dist <= auVar88._0_4_) {
        uVar49 = (local_1158->ptr).ptr;
        while ((uVar49 & 8) == 0) {
          uVar30 = uVar49 & 0xfffffffffffffff0;
          uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar50._4_4_ = uVar89;
          auVar50._0_4_ = uVar89;
          auVar50._8_4_ = uVar89;
          auVar50._12_4_ = uVar89;
          auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x80 + lVar45),auVar50,
                                    *(undefined1 (*) [16])(uVar30 + 0x20 + lVar45));
          auVar52 = vsubps_avx512vl(auVar52,auVar54);
          auVar51._0_4_ = fVar91 * auVar52._0_4_;
          auVar51._4_4_ = fVar102 * auVar52._4_4_;
          auVar51._8_4_ = fVar103 * auVar52._8_4_;
          auVar51._12_4_ = fVar104 * auVar52._12_4_;
          auVar52 = vmaxps_avx(auVar116._0_16_,auVar51);
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x80 + lVar47),auVar50,
                                    *(undefined1 (*) [16])(uVar30 + 0x20 + lVar47));
          auVar53 = vsubps_avx512vl(auVar53,auVar55);
          auVar57._0_4_ = auVar107._0_4_ * auVar53._0_4_;
          auVar57._4_4_ = auVar107._4_4_ * auVar53._4_4_;
          auVar57._8_4_ = auVar107._8_4_ * auVar53._8_4_;
          auVar57._12_4_ = auVar107._12_4_ * auVar53._12_4_;
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xc0),auVar50,
                                    *(undefined1 (*) [16])(uVar30 + 0x60));
          auVar53 = vsubps_avx512vl(auVar53,auVar56);
          auVar62._0_4_ = auVar108._0_4_ * auVar53._0_4_;
          auVar62._4_4_ = auVar108._4_4_ * auVar53._4_4_;
          auVar62._8_4_ = auVar108._8_4_ * auVar53._8_4_;
          auVar62._12_4_ = auVar108._12_4_ * auVar53._12_4_;
          auVar53 = vmaxps_avx(auVar57,auVar62);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar52,auVar53)
          ;
          auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x90),auVar50,
                                    *(undefined1 (*) [16])(uVar30 + 0x30));
          auVar52 = vsubps_avx512vl(auVar52,auVar54);
          auVar75._0_4_ = fVar81 * auVar52._0_4_;
          auVar75._4_4_ = fVar109 * auVar52._4_4_;
          auVar75._8_4_ = fVar110 * auVar52._8_4_;
          auVar75._12_4_ = fVar111 * auVar52._12_4_;
          auVar52 = vminps_avx(auVar87._0_16_,auVar75);
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xb0),auVar50,
                                    *(undefined1 (*) [16])(uVar30 + 0x50));
          auVar53 = vsubps_avx512vl(auVar53,auVar55);
          auVar64._0_4_ = auVar112._0_4_ * auVar53._0_4_;
          auVar64._4_4_ = auVar112._4_4_ * auVar53._4_4_;
          auVar64._8_4_ = auVar112._8_4_ * auVar53._8_4_;
          auVar64._12_4_ = auVar112._12_4_ * auVar53._12_4_;
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xd0),auVar50,
                                    *(undefined1 (*) [16])(uVar30 + 0x70));
          auVar53 = vsubps_avx512vl(auVar53,auVar56);
          auVar74._0_4_ = auVar114._0_4_ * auVar53._0_4_;
          auVar74._4_4_ = auVar114._4_4_ * auVar53._4_4_;
          auVar74._8_4_ = auVar114._8_4_ * auVar53._8_4_;
          auVar74._12_4_ = auVar114._12_4_ * auVar53._12_4_;
          auVar53 = vminps_avx(auVar64,auVar74);
          auVar52 = vminps_avx(auVar52,auVar53);
          uVar20 = vcmpps_avx512vl((undefined1  [16])tNear.field_0,auVar52,2);
          uVar31 = (uint)uVar20;
          if (((uint)uVar49 & 7) == 6) {
            uVar21 = vcmpps_avx512vl(auVar50,*(undefined1 (*) [16])(uVar30 + 0xf0),1);
            uVar22 = vcmpps_avx512vl(auVar50,*(undefined1 (*) [16])(uVar30 + 0xe0),0xd);
            uVar31 = (uint)(byte)((byte)uVar21 & (byte)uVar22 & (byte)uVar20);
          }
          if ((byte)uVar31 == 0) {
            auVar52 = vmovshdup_avx(*(undefined1 (*) [16])
                                     ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc));
            auVar88 = ZEXT1664(auVar52);
            goto LAB_01bdb380;
          }
          lVar36 = 0;
          for (uVar49 = (ulong)(byte)uVar31; (uVar49 & 1) == 0;
              uVar49 = uVar49 >> 1 | 0x8000000000000000) {
            lVar36 = lVar36 + 1;
          }
          uVar49 = *(ulong *)(uVar30 + lVar36 * 8);
          uVar31 = (uVar31 & 0xff) - 1 & uVar31 & 0xff;
          uVar32 = (ulong)uVar31;
          if (uVar31 != 0) {
            uVar7 = tNear.field_0.i[lVar36];
            lVar36 = 0;
            for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
              lVar36 = lVar36 + 1;
            }
            uVar31 = uVar31 - 1 & uVar31;
            uVar37 = (ulong)uVar31;
            uVar32 = *(ulong *)(uVar30 + lVar36 * 8);
            uVar35 = tNear.field_0.i[lVar36];
            if (uVar31 == 0) {
              if (uVar7 < uVar35) {
                (local_1158->ptr).ptr = uVar32;
                local_1158->dist = uVar35;
                local_1158 = local_1158 + 1;
              }
              else {
                (local_1158->ptr).ptr = uVar49;
                local_1158->dist = uVar7;
                uVar49 = uVar32;
                local_1158 = local_1158 + 1;
              }
            }
            else {
              auVar72._8_8_ = 0;
              auVar72._0_8_ = uVar49;
              auVar52 = vpunpcklqdq_avx(auVar72,ZEXT416(uVar7));
              auVar73._8_8_ = 0;
              auVar73._0_8_ = uVar32;
              auVar53 = vpunpcklqdq_avx(auVar73,ZEXT416(uVar35));
              lVar36 = 0;
              for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
                lVar36 = lVar36 + 1;
              }
              uVar31 = uVar31 - 1 & uVar31;
              uVar49 = (ulong)uVar31;
              auVar63._8_8_ = 0;
              auVar63._0_8_ = *(ulong *)(uVar30 + lVar36 * 8);
              auVar75 = vpunpcklqdq_avx(auVar63,ZEXT416((uint)tNear.field_0.i[lVar36]));
              auVar50 = vpshufd_avx(auVar52,0xaa);
              auVar51 = vpshufd_avx(auVar53,0xaa);
              auVar57 = vpshufd_avx(auVar75,0xaa);
              if (uVar31 == 0) {
                uVar49 = vpcmpgtd_avx512vl(auVar51,auVar50);
                uVar49 = uVar49 & 0xf;
                auVar51 = vpblendmd_avx512vl(auVar53,auVar52);
                bVar10 = (bool)((byte)uVar49 & 1);
                auVar77._0_4_ = (uint)bVar10 * auVar51._0_4_ | (uint)!bVar10 * auVar50._0_4_;
                bVar10 = (bool)((byte)(uVar49 >> 1) & 1);
                auVar77._4_4_ = (uint)bVar10 * auVar51._4_4_ | (uint)!bVar10 * auVar50._4_4_;
                bVar10 = (bool)((byte)(uVar49 >> 2) & 1);
                auVar77._8_4_ = (uint)bVar10 * auVar51._8_4_ | (uint)!bVar10 * auVar50._8_4_;
                bVar10 = SUB81(uVar49 >> 3,0);
                auVar77._12_4_ = (uint)bVar10 * auVar51._12_4_ | (uint)!bVar10 * auVar50._12_4_;
                auVar53 = vmovdqa32_avx512vl(auVar53);
                bVar10 = (bool)((byte)uVar49 & 1);
                auVar78._0_4_ = (uint)bVar10 * auVar53._0_4_ | (uint)!bVar10 * auVar52._0_4_;
                bVar10 = (bool)((byte)(uVar49 >> 1) & 1);
                auVar78._4_4_ = (uint)bVar10 * auVar53._4_4_ | (uint)!bVar10 * auVar52._4_4_;
                bVar10 = (bool)((byte)(uVar49 >> 2) & 1);
                auVar78._8_4_ = (uint)bVar10 * auVar53._8_4_ | (uint)!bVar10 * auVar52._8_4_;
                bVar10 = SUB81(uVar49 >> 3,0);
                auVar78._12_4_ = (uint)bVar10 * auVar53._12_4_ | (uint)!bVar10 * auVar52._12_4_;
                auVar52 = vpshufd_avx(auVar77,0xaa);
                uVar30 = vpcmpgtd_avx512vl(auVar57,auVar52);
                uVar30 = uVar30 & 0xf;
                auVar53 = vpblendmd_avx512vl(auVar75,auVar77);
                bVar10 = (bool)((byte)uVar30 & 1);
                bVar11 = (bool)((byte)(uVar30 >> 1) & 1);
                uVar49 = CONCAT44((uint)bVar11 * auVar53._4_4_ | (uint)!bVar11 * auVar52._4_4_,
                                  (uint)bVar10 * auVar53._0_4_ | (uint)!bVar10 * auVar52._0_4_);
                auVar52 = vmovdqa32_avx512vl(auVar75);
                bVar10 = (bool)((byte)uVar30 & 1);
                auVar58._0_4_ = (uint)bVar10 * auVar52._0_4_ | !bVar10 * auVar77._0_4_;
                bVar10 = (bool)((byte)(uVar30 >> 1) & 1);
                auVar58._4_4_ = (uint)bVar10 * auVar52._4_4_ | !bVar10 * auVar77._4_4_;
                bVar10 = (bool)((byte)(uVar30 >> 2) & 1);
                auVar58._8_4_ = (uint)bVar10 * auVar52._8_4_ | !bVar10 * auVar77._8_4_;
                bVar10 = SUB81(uVar30 >> 3,0);
                auVar58._12_4_ = (uint)bVar10 * auVar52._12_4_ | !bVar10 * auVar77._12_4_;
                auVar52 = vpshufd_avx(auVar58,0xaa);
                auVar53 = vpshufd_avx(auVar78,0xaa);
                uVar30 = vpcmpgtd_avx512vl(auVar52,auVar53);
                uVar30 = uVar30 & 0xf;
                auVar53 = vpblendmd_avx512vl(auVar58,auVar78);
                bVar10 = (bool)((byte)uVar30 & 1);
                bVar12 = (bool)((byte)(uVar30 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar30 >> 2) & 1);
                bVar16 = SUB81(uVar30 >> 3,0);
                auVar50 = vmovdqa32_avx512vl(auVar58);
                bVar11 = (bool)((byte)uVar30 & 1);
                bVar13 = (bool)((byte)(uVar30 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar30 >> 2) & 1);
                bVar17 = SUB81(uVar30 >> 3,0);
                *(uint *)&(local_1158->ptr).ptr =
                     (uint)bVar11 * auVar50._0_4_ | !bVar11 * auVar78._0_4_;
                *(uint *)((long)&(local_1158->ptr).ptr + 4) =
                     (uint)bVar13 * auVar50._4_4_ | !bVar13 * auVar78._4_4_;
                local_1158->dist = (uint)bVar15 * auVar50._8_4_ | !bVar15 * auVar78._8_4_;
                *(uint *)&local_1158->field_0xc =
                     (uint)bVar17 * auVar50._12_4_ | !bVar17 * auVar78._12_4_;
                *(uint *)&local_1158[1].ptr.ptr =
                     (uint)bVar10 * auVar53._0_4_ | (uint)!bVar10 * auVar52._0_4_;
                *(uint *)((long)&local_1158[1].ptr.ptr + 4) =
                     (uint)bVar12 * auVar53._4_4_ | (uint)!bVar12 * auVar52._4_4_;
                local_1158[1].dist = (uint)bVar14 * auVar53._8_4_ | (uint)!bVar14 * auVar52._8_4_;
                *(uint *)&local_1158[1].field_0xc =
                     (uint)bVar16 * auVar53._12_4_ | (uint)!bVar16 * auVar52._12_4_;
                local_1158 = local_1158 + 2;
              }
              else {
                lVar36 = 0;
                for (; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
                  lVar36 = lVar36 + 1;
                }
                uVar31 = tNear.field_0.i[lVar36];
                auVar76._8_8_ = 0;
                auVar76._0_8_ = *(ulong *)(uVar30 + lVar36 * 8);
                auVar62 = vpunpcklqdq_avx(auVar76,ZEXT416(uVar31));
                uVar49 = vpcmpgtd_avx512vl(auVar51,auVar50);
                uVar49 = uVar49 & 0xf;
                auVar51 = vpblendmd_avx512vl(auVar53,auVar52);
                bVar10 = (bool)((byte)uVar49 & 1);
                auVar65._0_4_ = (uint)bVar10 * auVar51._0_4_ | (uint)!bVar10 * auVar50._0_4_;
                bVar10 = (bool)((byte)(uVar49 >> 1) & 1);
                auVar65._4_4_ = (uint)bVar10 * auVar51._4_4_ | (uint)!bVar10 * auVar50._4_4_;
                bVar10 = (bool)((byte)(uVar49 >> 2) & 1);
                auVar65._8_4_ = (uint)bVar10 * auVar51._8_4_ | (uint)!bVar10 * auVar50._8_4_;
                bVar10 = SUB81(uVar49 >> 3,0);
                auVar65._12_4_ = (uint)bVar10 * auVar51._12_4_ | (uint)!bVar10 * auVar50._12_4_;
                auVar53 = vmovdqa32_avx512vl(auVar53);
                bVar10 = (bool)((byte)uVar49 & 1);
                auVar66._0_4_ = (uint)bVar10 * auVar53._0_4_ | (uint)!bVar10 * auVar52._0_4_;
                bVar10 = (bool)((byte)(uVar49 >> 1) & 1);
                auVar66._4_4_ = (uint)bVar10 * auVar53._4_4_ | (uint)!bVar10 * auVar52._4_4_;
                bVar10 = (bool)((byte)(uVar49 >> 2) & 1);
                auVar66._8_4_ = (uint)bVar10 * auVar53._8_4_ | (uint)!bVar10 * auVar52._8_4_;
                bVar10 = SUB81(uVar49 >> 3,0);
                auVar66._12_4_ = (uint)bVar10 * auVar53._12_4_ | (uint)!bVar10 * auVar52._12_4_;
                auVar71._4_4_ = uVar31;
                auVar71._0_4_ = uVar31;
                auVar71._8_4_ = uVar31;
                auVar71._12_4_ = uVar31;
                uVar49 = vpcmpgtd_avx512vl(auVar71,auVar57);
                uVar49 = uVar49 & 0xf;
                auVar52 = vpblendmd_avx512vl(auVar62,auVar75);
                bVar10 = (bool)((byte)uVar49 & 1);
                auVar69._0_4_ = (uint)bVar10 * auVar52._0_4_ | !bVar10 * uVar31;
                bVar10 = (bool)((byte)(uVar49 >> 1) & 1);
                auVar69._4_4_ = (uint)bVar10 * auVar52._4_4_ | !bVar10 * uVar31;
                bVar10 = (bool)((byte)(uVar49 >> 2) & 1);
                auVar69._8_4_ = (uint)bVar10 * auVar52._8_4_ | !bVar10 * uVar31;
                bVar10 = SUB81(uVar49 >> 3,0);
                auVar69._12_4_ = (uint)bVar10 * auVar52._12_4_ | !bVar10 * uVar31;
                auVar52 = vmovdqa32_avx512vl(auVar62);
                bVar10 = (bool)((byte)uVar49 & 1);
                auVar67._0_4_ = (uint)bVar10 * auVar52._0_4_ | (uint)!bVar10 * auVar75._0_4_;
                bVar10 = (bool)((byte)(uVar49 >> 1) & 1);
                auVar67._4_4_ = (uint)bVar10 * auVar52._4_4_ | (uint)!bVar10 * auVar75._4_4_;
                bVar10 = (bool)((byte)(uVar49 >> 2) & 1);
                auVar67._8_4_ = (uint)bVar10 * auVar52._8_4_ | (uint)!bVar10 * auVar75._8_4_;
                bVar10 = SUB81(uVar49 >> 3,0);
                auVar67._12_4_ = (uint)bVar10 * auVar52._12_4_ | (uint)!bVar10 * auVar75._12_4_;
                auVar52 = vpshufd_avx(auVar67,0xaa);
                auVar53 = vpshufd_avx(auVar66,0xaa);
                uVar49 = vpcmpgtd_avx512vl(auVar52,auVar53);
                uVar49 = uVar49 & 0xf;
                auVar53 = vpblendmd_avx512vl(auVar67,auVar66);
                bVar10 = (bool)((byte)uVar49 & 1);
                auVar68._0_4_ = (uint)bVar10 * auVar53._0_4_ | (uint)!bVar10 * auVar52._0_4_;
                bVar10 = (bool)((byte)(uVar49 >> 1) & 1);
                auVar68._4_4_ = (uint)bVar10 * auVar53._4_4_ | (uint)!bVar10 * auVar52._4_4_;
                bVar10 = (bool)((byte)(uVar49 >> 2) & 1);
                auVar68._8_4_ = (uint)bVar10 * auVar53._8_4_ | (uint)!bVar10 * auVar52._8_4_;
                bVar10 = SUB81(uVar49 >> 3,0);
                auVar68._12_4_ = (uint)bVar10 * auVar53._12_4_ | (uint)!bVar10 * auVar52._12_4_;
                auVar50 = vmovdqa32_avx512vl(auVar67);
                bVar10 = (bool)((byte)uVar49 & 1);
                bVar12 = (bool)((byte)(uVar49 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar49 >> 2) & 1);
                bVar15 = SUB81(uVar49 >> 3,0);
                auVar52 = vpshufd_avx(auVar69,0xaa);
                auVar53 = vpshufd_avx(auVar65,0xaa);
                uVar30 = vpcmpgtd_avx512vl(auVar52,auVar53);
                uVar30 = uVar30 & 0xf;
                auVar53 = vpblendmd_avx512vl(auVar69,auVar65);
                bVar11 = (bool)((byte)uVar30 & 1);
                bVar13 = (bool)((byte)(uVar30 >> 1) & 1);
                uVar49 = CONCAT44((uint)bVar13 * auVar53._4_4_ | (uint)!bVar13 * auVar52._4_4_,
                                  (uint)bVar11 * auVar53._0_4_ | (uint)!bVar11 * auVar52._0_4_);
                auVar52 = vmovdqa32_avx512vl(auVar69);
                bVar11 = (bool)((byte)uVar30 & 1);
                auVar70._0_4_ = (uint)bVar11 * auVar52._0_4_ | !bVar11 * auVar65._0_4_;
                bVar11 = (bool)((byte)(uVar30 >> 1) & 1);
                auVar70._4_4_ = (uint)bVar11 * auVar52._4_4_ | !bVar11 * auVar65._4_4_;
                bVar11 = (bool)((byte)(uVar30 >> 2) & 1);
                auVar70._8_4_ = (uint)bVar11 * auVar52._8_4_ | !bVar11 * auVar65._8_4_;
                bVar11 = SUB81(uVar30 >> 3,0);
                auVar70._12_4_ = (uint)bVar11 * auVar52._12_4_ | !bVar11 * auVar65._12_4_;
                auVar52 = vpshufd_avx(auVar70,0xaa);
                auVar53 = vpshufd_avx(auVar68,0xaa);
                uVar30 = vpcmpgtd_avx512vl(auVar53,auVar52);
                uVar30 = uVar30 & 0xf;
                auVar53 = vpblendmd_avx512vl(auVar68,auVar70);
                bVar11 = (bool)((byte)uVar30 & 1);
                SVar59.ptr.ptr._0_4_ = (uint)bVar11 * auVar53._0_4_ | (uint)!bVar11 * auVar52._0_4_;
                bVar11 = (bool)((byte)(uVar30 >> 1) & 1);
                SVar59.ptr.ptr._4_4_ = (uint)bVar11 * auVar53._4_4_ | (uint)!bVar11 * auVar52._4_4_;
                bVar11 = (bool)((byte)(uVar30 >> 2) & 1);
                SVar59.dist = (uint)bVar11 * auVar53._8_4_ | (uint)!bVar11 * auVar52._8_4_;
                bVar11 = SUB81(uVar30 >> 3,0);
                SVar59._12_4_ = (uint)bVar11 * auVar53._12_4_ | (uint)!bVar11 * auVar52._12_4_;
                auVar52 = vmovdqa32_avx512vl(auVar68);
                bVar11 = (bool)((byte)uVar30 & 1);
                SVar60.ptr.ptr._0_4_ = (uint)bVar11 * auVar52._0_4_ | !bVar11 * auVar70._0_4_;
                bVar11 = (bool)((byte)(uVar30 >> 1) & 1);
                SVar60.ptr.ptr._4_4_ = (uint)bVar11 * auVar52._4_4_ | !bVar11 * auVar70._4_4_;
                bVar11 = (bool)((byte)(uVar30 >> 2) & 1);
                SVar60.dist = (uint)bVar11 * auVar52._8_4_ | !bVar11 * auVar70._8_4_;
                bVar11 = SUB81(uVar30 >> 3,0);
                SVar60._12_4_ = (uint)bVar11 * auVar52._12_4_ | !bVar11 * auVar70._12_4_;
                *(uint *)&(local_1158->ptr).ptr =
                     (uint)bVar10 * auVar50._0_4_ | !bVar10 * auVar66._0_4_;
                *(uint *)((long)&(local_1158->ptr).ptr + 4) =
                     (uint)bVar12 * auVar50._4_4_ | !bVar12 * auVar66._4_4_;
                local_1158->dist = (uint)bVar14 * auVar50._8_4_ | !bVar14 * auVar66._8_4_;
                *(uint *)&local_1158->field_0xc =
                     (uint)bVar15 * auVar50._12_4_ | !bVar15 * auVar66._12_4_;
                local_1158[1] = SVar60;
                local_1158[2] = SVar59;
                local_1158 = local_1158 + 3;
              }
            }
          }
        }
        local_1150 = (ulong)((uint)uVar49 & 0xf) - 8;
        uVar49 = uVar49 & 0xfffffffffffffff0;
        for (local_1148 = 0; local_1148 != local_1150; local_1148 = local_1148 + 1) {
          lVar36 = local_1148 * 0x50;
          local_1140 = context->scene;
          pGVar8 = (context->scene->geometries).items[*(uint *)(uVar49 + 0x30 + lVar36)].ptr;
          fVar102 = (pGVar8->time_range).lower;
          fVar102 = pGVar8->fnumTimeSegments *
                    (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar102) /
                    ((pGVar8->time_range).upper - fVar102));
          auVar52 = vroundss_avx(ZEXT416((uint)fVar102),ZEXT416((uint)fVar102),9);
          auVar52 = vminss_avx(auVar52,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
          auVar61 = vmaxss_avx512f(auVar117._0_16_,auVar52);
          lVar47 = (long)(int)auVar61._0_4_ * 0x38;
          uVar43 = CONCAT44(0,*(uint *)(uVar49 + lVar36));
          local_1178._0_8_ = uVar43;
          uVar40 = CONCAT44(0,*(uint *)(uVar49 + 4 + lVar36));
          local_1188._0_8_ = uVar40;
          lVar45 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar47);
          lVar47 = *(long *)(*(long *)&pGVar8[2].numPrimitives + 0x38 + lVar47);
          auVar52 = *(undefined1 (*) [16])(lVar45 + uVar43 * 4);
          uVar30 = (ulong)*(uint *)(uVar49 + 0x10 + lVar36);
          auVar53 = *(undefined1 (*) [16])(lVar45 + uVar30 * 4);
          uVar32 = (ulong)*(uint *)(uVar49 + 0x20 + lVar36);
          auVar50 = *(undefined1 (*) [16])(lVar45 + uVar32 * 4);
          auVar51 = *(undefined1 (*) [16])(lVar45 + uVar40 * 4);
          uVar37 = (ulong)*(uint *)(uVar49 + 0x14 + lVar36);
          auVar57 = *(undefined1 (*) [16])(lVar45 + uVar37 * 4);
          uVar38 = (ulong)*(uint *)(uVar49 + 0x24 + lVar36);
          auVar75 = *(undefined1 (*) [16])(lVar45 + uVar38 * 4);
          uVar48 = (ulong)*(uint *)(uVar49 + 8 + lVar36);
          auVar62 = *(undefined1 (*) [16])(lVar45 + uVar48 * 4);
          uVar46 = (ulong)*(uint *)(uVar49 + 0x18 + lVar36);
          auVar64 = *(undefined1 (*) [16])(lVar45 + uVar46 * 4);
          uVar44 = (ulong)*(uint *)(uVar49 + 0x28 + lVar36);
          auVar74 = *(undefined1 (*) [16])(lVar45 + uVar44 * 4);
          uVar42 = (ulong)*(uint *)(uVar49 + 0xc + lVar36);
          auVar72 = *(undefined1 (*) [16])(lVar45 + uVar42 * 4);
          uVar41 = (ulong)*(uint *)(uVar49 + 0x1c + lVar36);
          auVar73 = *(undefined1 (*) [16])(lVar45 + uVar41 * 4);
          uVar39 = (ulong)*(uint *)(uVar49 + 0x2c + lVar36);
          auVar63 = *(undefined1 (*) [16])(lVar45 + uVar39 * 4);
          auVar65 = *(undefined1 (*) [16])(lVar47 + uVar43 * 4);
          auVar66 = *(undefined1 (*) [16])(lVar47 + uVar30 * 4);
          auVar69 = *(undefined1 (*) [16])(lVar47 + uVar32 * 4);
          auVar67 = *(undefined1 (*) [16])(lVar47 + uVar40 * 4);
          auVar68 = *(undefined1 (*) [16])(lVar47 + uVar37 * 4);
          auVar70 = *(undefined1 (*) [16])(lVar47 + uVar38 * 4);
          auVar71 = *(undefined1 (*) [16])(lVar47 + uVar48 * 4);
          auVar76 = *(undefined1 (*) [16])(lVar47 + uVar46 * 4);
          auVar77 = *(undefined1 (*) [16])(lVar47 + uVar44 * 4);
          auVar78 = *(undefined1 (*) [16])(lVar47 + uVar42 * 4);
          auVar58 = *(undefined1 (*) [16])(lVar47 + uVar41 * 4);
          auVar4 = *(undefined1 (*) [16])(lVar47 + uVar39 * 4);
          puVar1 = (undefined8 *)(uVar49 + 0x30 + lVar36);
          local_f88 = *puVar1;
          uStack_f80 = puVar1[1];
          puVar1 = (undefined8 *)(uVar49 + 0x40 + lVar36);
          auVar18 = vunpcklps_avx(auVar52,auVar62);
          auVar52 = vunpckhps_avx(auVar52,auVar62);
          auVar62 = vunpcklps_avx(auVar51,auVar72);
          auVar51 = vunpckhps_avx(auVar51,auVar72);
          auVar72 = vunpcklps_avx(auVar52,auVar51);
          auVar19 = vunpcklps_avx(auVar18,auVar62);
          auVar52 = vunpckhps_avx(auVar18,auVar62);
          auVar62 = vunpcklps_avx(auVar53,auVar64);
          auVar53 = vunpckhps_avx(auVar53,auVar64);
          auVar64 = vunpcklps_avx(auVar57,auVar73);
          auVar51 = vunpckhps_avx(auVar57,auVar73);
          auVar57 = vunpcklps_avx(auVar53,auVar51);
          auVar73 = vunpcklps_avx(auVar62,auVar64);
          auVar53 = vunpckhps_avx(auVar62,auVar64);
          auVar62 = vunpcklps_avx(auVar50,auVar74);
          auVar50 = vunpckhps_avx(auVar50,auVar74);
          auVar64 = vunpcklps_avx(auVar75,auVar63);
          auVar51 = vunpckhps_avx(auVar75,auVar63);
          auVar75 = vunpcklps_avx(auVar50,auVar51);
          auVar74 = vunpcklps_avx(auVar62,auVar64);
          auVar50 = vunpckhps_avx(auVar62,auVar64);
          auVar51 = vunpcklps_avx512vl(auVar65,auVar71);
          auVar62 = vunpckhps_avx512vl(auVar65,auVar71);
          auVar63 = vunpcklps_avx512vl(auVar67,auVar78);
          auVar64 = vunpckhps_avx512vl(auVar67,auVar78);
          auVar62 = vunpcklps_avx(auVar62,auVar64);
          auVar64 = vunpcklps_avx(auVar51,auVar63);
          auVar51 = vunpckhps_avx(auVar51,auVar63);
          auVar63 = vunpcklps_avx512vl(auVar66,auVar76);
          auVar65 = vunpckhps_avx512vl(auVar66,auVar76);
          auVar66 = vunpcklps_avx512vl(auVar68,auVar58);
          auVar67 = vunpckhps_avx512vl(auVar68,auVar58);
          auVar65 = vunpcklps_avx512vl(auVar65,auVar67);
          auVar67 = vunpcklps_avx512vl(auVar63,auVar66);
          auVar66 = vunpckhps_avx512vl(auVar63,auVar66);
          auVar68 = vunpcklps_avx512vl(auVar69,auVar77);
          auVar63 = vunpckhps_avx512vl(auVar69,auVar77);
          auVar69 = vunpcklps_avx512vl(auVar70,auVar4);
          auVar70 = vunpckhps_avx512vl(auVar70,auVar4);
          auVar63 = vunpcklps_avx(auVar63,auVar70);
          auVar70 = vunpcklps_avx512vl(auVar68,auVar69);
          auVar69 = vunpckhps_avx512vl(auVar68,auVar69);
          auVar71 = ZEXT416((uint)(fVar102 - auVar61._0_4_));
          auVar68 = vbroadcastss_avx512vl(auVar71);
          auVar71 = vsubss_avx512f(ZEXT416(0x3f800000),auVar71);
          auVar61._0_4_ = auVar71._0_4_;
          auVar61._4_4_ = auVar61._0_4_;
          auVar61._8_4_ = auVar61._0_4_;
          auVar61._12_4_ = auVar61._0_4_;
          auVar64 = vmulps_avx512vl(auVar68,auVar64);
          auVar71 = vmulps_avx512vl(auVar68,auVar51);
          auVar62 = vmulps_avx512vl(auVar68,auVar62);
          auVar51 = vfmadd231ps_fma(auVar64,auVar61,auVar19);
          auVar71 = vfmadd231ps_avx512vl(auVar71,auVar61,auVar52);
          auVar62 = vfmadd231ps_fma(auVar62,auVar61,auVar72);
          auVar52 = vmulps_avx512vl(auVar68,auVar67);
          auVar72 = vmulps_avx512vl(auVar68,auVar66);
          auVar65 = vmulps_avx512vl(auVar68,auVar65);
          auVar64 = vfmadd231ps_fma(auVar52,auVar61,auVar73);
          auVar72 = vfmadd231ps_fma(auVar72,auVar61,auVar53);
          auVar73 = vfmadd231ps_avx512vl(auVar65,auVar61,auVar57);
          auVar52 = vmulps_avx512vl(auVar68,auVar70);
          auVar53 = vmulps_avx512vl(auVar68,auVar69);
          auVar63 = vmulps_avx512vl(auVar68,auVar63);
          auVar57 = vfmadd231ps_fma(auVar52,auVar61,auVar74);
          auVar74 = vfmadd231ps_fma(auVar53,auVar61,auVar50);
          auVar75 = vfmadd231ps_fma(auVar63,auVar61,auVar75);
          local_10a8 = *puVar1;
          uStack_10a0 = puVar1[1];
          uVar89 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar82._4_4_ = uVar89;
          auVar82._0_4_ = uVar89;
          auVar82._8_4_ = uVar89;
          auVar82._12_4_ = uVar89;
          uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar90._4_4_ = uVar89;
          auVar90._0_4_ = uVar89;
          auVar90._8_4_ = uVar89;
          auVar90._12_4_ = uVar89;
          uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar98._4_4_ = uVar89;
          auVar98._0_4_ = uVar89;
          auVar98._8_4_ = uVar89;
          auVar98._12_4_ = uVar89;
          uVar89 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
          auVar94._4_4_ = uVar89;
          auVar94._0_4_ = uVar89;
          auVar94._8_4_ = uVar89;
          auVar94._12_4_ = uVar89;
          uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
          auVar96._4_4_ = uVar89;
          auVar96._0_4_ = uVar89;
          auVar96._8_4_ = uVar89;
          auVar96._12_4_ = uVar89;
          fVar102 = (ray->super_RayK<1>).dir.field_0.m128[2];
          auVar105._4_4_ = fVar102;
          auVar105._0_4_ = fVar102;
          auVar105._8_4_ = fVar102;
          auVar105._12_4_ = fVar102;
          auVar52 = vsubps_avx(auVar51,auVar82);
          auVar63 = vsubps_avx512vl(auVar71,auVar90);
          auVar53 = vsubps_avx(auVar62,auVar98);
          auVar50 = vsubps_avx(auVar64,auVar82);
          auVar62 = vsubps_avx512vl(auVar72,auVar90);
          auVar64 = vsubps_avx512vl(auVar73,auVar98);
          auVar72 = vsubps_avx512vl(auVar57,auVar82);
          auVar51 = vsubps_avx(auVar74,auVar90);
          auVar74 = vsubps_avx512vl(auVar75,auVar98);
          auVar73 = vsubps_avx512vl(auVar72,auVar52);
          auVar57 = vsubps_avx(auVar51,auVar63);
          auVar65 = vsubps_avx512vl(auVar74,auVar53);
          auVar66 = vsubps_avx512vl(auVar52,auVar50);
          auVar69 = vsubps_avx512vl(auVar63,auVar62);
          auVar67 = vsubps_avx512vl(auVar53,auVar64);
          auVar68 = vsubps_avx512vl(auVar50,auVar72);
          auVar70 = vsubps_avx512vl(auVar62,auVar51);
          auVar71 = vsubps_avx512vl(auVar64,auVar74);
          auVar75 = vaddps_avx512vl(auVar72,auVar52);
          auVar99._0_4_ = auVar51._0_4_ + auVar63._0_4_;
          auVar99._4_4_ = auVar51._4_4_ + auVar63._4_4_;
          auVar99._8_4_ = auVar51._8_4_ + auVar63._8_4_;
          auVar99._12_4_ = auVar51._12_4_ + auVar63._12_4_;
          auVar76 = vaddps_avx512vl(auVar74,auVar53);
          auVar77 = vmulps_avx512vl(auVar99,auVar65);
          auVar77 = vfmsub231ps_avx512vl(auVar77,auVar57,auVar76);
          auVar76 = vmulps_avx512vl(auVar76,auVar73);
          auVar76 = vfmsub231ps_avx512vl(auVar76,auVar65,auVar75);
          auVar92._0_4_ = auVar57._0_4_ * auVar75._0_4_;
          auVar92._4_4_ = auVar57._4_4_ * auVar75._4_4_;
          auVar92._8_4_ = auVar57._8_4_ * auVar75._8_4_;
          auVar92._12_4_ = auVar57._12_4_ * auVar75._12_4_;
          auVar75 = vfmsub231ps_fma(auVar92,auVar73,auVar99);
          auVar93._0_4_ = fVar102 * auVar75._0_4_;
          auVar93._4_4_ = fVar102 * auVar75._4_4_;
          auVar93._8_4_ = fVar102 * auVar75._8_4_;
          auVar93._12_4_ = fVar102 * auVar75._12_4_;
          auVar75 = vfmadd231ps_avx512vl(auVar93,auVar96,auVar76);
          tNear.field_0 =
               (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
               vfmadd231ps_avx512vl(auVar75,auVar94,auVar77);
          auVar100._0_4_ = auVar50._0_4_ + auVar52._0_4_;
          auVar100._4_4_ = auVar50._4_4_ + auVar52._4_4_;
          auVar100._8_4_ = auVar50._8_4_ + auVar52._8_4_;
          auVar100._12_4_ = auVar50._12_4_ + auVar52._12_4_;
          auVar75 = vaddps_avx512vl(auVar63,auVar62);
          auVar76 = vaddps_avx512vl(auVar53,auVar64);
          auVar77 = vmulps_avx512vl(auVar75,auVar67);
          auVar77 = vfmsub231ps_avx512vl(auVar77,auVar69,auVar76);
          auVar76 = vmulps_avx512vl(auVar76,auVar66);
          auVar76 = vfmsub231ps_avx512vl(auVar76,auVar67,auVar100);
          auVar78 = vmulps_avx512vl(auVar100,auVar69);
          auVar75 = vfmsub231ps_avx512vl(auVar78,auVar66,auVar75);
          auVar101._0_4_ = fVar102 * auVar75._0_4_;
          auVar101._4_4_ = fVar102 * auVar75._4_4_;
          auVar101._8_4_ = fVar102 * auVar75._8_4_;
          auVar101._12_4_ = fVar102 * auVar75._12_4_;
          auVar75 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar76);
          auVar75 = vfmadd231ps_avx512vl(auVar75,auVar94,auVar77);
          auVar50 = vaddps_avx512vl(auVar50,auVar72);
          auVar51 = vaddps_avx512vl(auVar62,auVar51);
          auVar62 = vaddps_avx512vl(auVar64,auVar74);
          auVar64 = vmulps_avx512vl(auVar51,auVar71);
          auVar64 = vfmsub231ps_avx512vl(auVar64,auVar70,auVar62);
          auVar62 = vmulps_avx512vl(auVar62,auVar68);
          auVar62 = vfmsub231ps_avx512vl(auVar62,auVar71,auVar50);
          auVar115._0_4_ = auVar50._0_4_ * auVar70._0_4_;
          auVar115._4_4_ = auVar50._4_4_ * auVar70._4_4_;
          auVar115._8_4_ = auVar50._8_4_ * auVar70._8_4_;
          auVar115._12_4_ = auVar50._12_4_ * auVar70._12_4_;
          auVar50 = vfmsub231ps_fma(auVar115,auVar68,auVar51);
          auVar50 = vmulps_avx512vl(auVar105,auVar50);
          auVar50 = vfmadd231ps_avx512vl(auVar50,auVar96,auVar62);
          auVar50 = vfmadd231ps_avx512vl(auVar50,auVar94,auVar64);
          auVar113._0_4_ = auVar75._0_4_ + tNear.field_0._0_4_;
          auVar113._4_4_ = auVar75._4_4_ + tNear.field_0._4_4_;
          auVar113._8_4_ = auVar75._8_4_ + tNear.field_0._8_4_;
          auVar113._12_4_ = auVar75._12_4_ + tNear.field_0._12_4_;
          auVar51 = vaddps_avx512vl(auVar50,auVar113);
          auVar4._8_4_ = 0x7fffffff;
          auVar4._0_8_ = 0x7fffffff7fffffff;
          auVar4._12_4_ = 0x7fffffff;
          auVar62 = vandps_avx512vl(auVar51,auVar4);
          auVar18._8_4_ = 0x34000000;
          auVar18._0_8_ = 0x3400000034000000;
          auVar18._12_4_ = 0x34000000;
          auVar64 = vmulps_avx512vl(auVar62,auVar18);
          auVar74 = vminps_avx512vl((undefined1  [16])tNear.field_0,auVar75);
          auVar74 = vminps_avx512vl(auVar74,auVar50);
          auVar19._8_4_ = 0x80000000;
          auVar19._0_8_ = 0x8000000080000000;
          auVar19._12_4_ = 0x80000000;
          auVar72 = vxorps_avx512vl(auVar64,auVar19);
          uVar20 = vcmpps_avx512vl(auVar74,auVar72,5);
          auVar74 = vmaxps_avx512vl((undefined1  [16])tNear.field_0,auVar75);
          auVar50 = vmaxps_avx512vl(auVar74,auVar50);
          uVar21 = vcmpps_avx512vl(auVar50,auVar64,2);
          bVar23 = ((byte)uVar20 | (byte)uVar21) & 0xf;
          if (bVar23 != 0) {
            auVar50 = vmulps_avx512vl(auVar65,auVar69);
            auVar64 = vmulps_avx512vl(auVar73,auVar67);
            auVar74 = vmulps_avx512vl(auVar57,auVar66);
            auVar72 = vmulps_avx512vl(auVar67,auVar70);
            auVar76 = vmulps_avx512vl(auVar66,auVar71);
            auVar77 = vmulps_avx512vl(auVar69,auVar68);
            auVar57 = vfmsub213ps_avx512vl(auVar57,auVar67,auVar50);
            auVar65 = vfmsub213ps_avx512vl(auVar65,auVar66,auVar64);
            auVar73 = vfmsub213ps_avx512vl(auVar73,auVar69,auVar74);
            auVar69 = vfmsub213ps_avx512vl(auVar71,auVar69,auVar72);
            auVar67 = vfmsub213ps_avx512vl(auVar68,auVar67,auVar76);
            auVar66 = vfmsub213ps_avx512vl(auVar70,auVar66,auVar77);
            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar50 = vandps_avx512vl(auVar50,auVar68);
            auVar72 = vandps_avx512vl(auVar72,auVar68);
            uVar30 = vcmpps_avx512vl(auVar50,auVar72,1);
            auVar50 = vandps_avx512vl(auVar64,auVar68);
            auVar64 = vandps_avx512vl(auVar76,auVar68);
            uVar32 = vcmpps_avx512vl(auVar50,auVar64,1);
            auVar50 = vandps_avx512vl(auVar74,auVar68);
            auVar64 = vandps_avx512vl(auVar77,auVar68);
            uVar37 = vcmpps_avx512vl(auVar50,auVar64,1);
            bVar10 = (bool)((byte)uVar30 & 1);
            local_1028._0_4_ = (uint)bVar10 * auVar57._0_4_ | (uint)!bVar10 * auVar69._0_4_;
            bVar10 = (bool)((byte)(uVar30 >> 1) & 1);
            local_1028._4_4_ = (uint)bVar10 * auVar57._4_4_ | (uint)!bVar10 * auVar69._4_4_;
            bVar10 = (bool)((byte)(uVar30 >> 2) & 1);
            local_1028._8_4_ = (uint)bVar10 * auVar57._8_4_ | (uint)!bVar10 * auVar69._8_4_;
            bVar10 = (bool)((byte)(uVar30 >> 3) & 1);
            local_1028._12_4_ = (uint)bVar10 * auVar57._12_4_ | (uint)!bVar10 * auVar69._12_4_;
            bVar10 = (bool)((byte)uVar32 & 1);
            local_1018._0_4_ = (uint)bVar10 * auVar65._0_4_ | (uint)!bVar10 * auVar67._0_4_;
            bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
            local_1018._4_4_ = (uint)bVar10 * auVar65._4_4_ | (uint)!bVar10 * auVar67._4_4_;
            bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
            local_1018._8_4_ = (uint)bVar10 * auVar65._8_4_ | (uint)!bVar10 * auVar67._8_4_;
            bVar10 = (bool)((byte)(uVar32 >> 3) & 1);
            local_1018._12_4_ = (uint)bVar10 * auVar65._12_4_ | (uint)!bVar10 * auVar67._12_4_;
            bVar10 = (bool)((byte)uVar37 & 1);
            local_1008[0] = (float)((uint)bVar10 * auVar73._0_4_ | (uint)!bVar10 * auVar66._0_4_);
            bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
            local_1008[1] = (float)((uint)bVar10 * auVar73._4_4_ | (uint)!bVar10 * auVar66._4_4_);
            bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
            local_1008[2] = (float)((uint)bVar10 * auVar73._8_4_ | (uint)!bVar10 * auVar66._8_4_);
            bVar10 = (bool)((byte)(uVar37 >> 3) & 1);
            local_1008[3] = (float)((uint)bVar10 * auVar73._12_4_ | (uint)!bVar10 * auVar66._12_4_);
            auVar106._0_4_ = fVar102 * local_1008[0];
            auVar106._4_4_ = fVar102 * local_1008[1];
            auVar106._8_4_ = fVar102 * local_1008[2];
            auVar106._12_4_ = fVar102 * local_1008[3];
            auVar50 = vfmadd213ps_fma(auVar96,local_1018,auVar106);
            auVar50 = vfmadd213ps_fma(auVar94,local_1028,auVar50);
            auVar95._0_4_ = auVar50._0_4_ + auVar50._0_4_;
            auVar95._4_4_ = auVar50._4_4_ + auVar50._4_4_;
            auVar95._8_4_ = auVar50._8_4_ + auVar50._8_4_;
            auVar95._12_4_ = auVar50._12_4_ + auVar50._12_4_;
            auVar97._0_4_ = auVar53._0_4_ * local_1008[0];
            auVar97._4_4_ = auVar53._4_4_ * local_1008[1];
            auVar97._8_4_ = auVar53._8_4_ * local_1008[2];
            auVar97._12_4_ = auVar53._12_4_ * local_1008[3];
            auVar53 = vfmadd213ps_fma(auVar63,local_1018,auVar97);
            auVar53 = vfmadd213ps_fma(auVar52,local_1028,auVar53);
            auVar52 = vrcp14ps_avx512vl(auVar95);
            auVar57 = auVar118._0_16_;
            auVar50 = vfnmadd213ps_avx512vl(auVar52,auVar95,auVar57);
            auVar52 = vfmadd132ps_fma(auVar50,auVar52,auVar52);
            local_1038._0_4_ = (auVar53._0_4_ + auVar53._0_4_) * auVar52._0_4_;
            local_1038._4_4_ = (auVar53._4_4_ + auVar53._4_4_) * auVar52._4_4_;
            local_1038._8_4_ = (auVar53._8_4_ + auVar53._8_4_) * auVar52._8_4_;
            local_1038._12_4_ = (auVar53._12_4_ + auVar53._12_4_) * auVar52._12_4_;
            auVar87 = ZEXT1664(local_1038);
            uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar24._4_4_ = uVar89;
            auVar24._0_4_ = uVar89;
            auVar24._8_4_ = uVar89;
            auVar24._12_4_ = uVar89;
            uVar20 = vcmpps_avx512vl(local_1038,auVar24,0xd);
            auVar25._8_4_ = 0x80000000;
            auVar25._0_8_ = 0x8000000080000000;
            auVar25._12_4_ = 0x80000000;
            auVar52 = vxorps_avx512vl(auVar95,auVar25);
            fVar102 = (ray->super_RayK<1>).tfar;
            auVar26._4_4_ = fVar102;
            auVar26._0_4_ = fVar102;
            auVar26._8_4_ = fVar102;
            auVar26._12_4_ = fVar102;
            uVar21 = vcmpps_avx512vl(local_1038,auVar26,2);
            uVar22 = vcmpps_avx512vl(auVar95,auVar52,4);
            bVar23 = (byte)uVar20 & (byte)uVar21 & (byte)uVar22 & bVar23;
            if (bVar23 != 0) {
              auVar5._0_4_ = (ray->super_RayK<1>).tfar;
              auVar5._4_4_ = (ray->super_RayK<1>).mask;
              auVar5._8_4_ = (ray->super_RayK<1>).id;
              auVar5._12_4_ = (ray->super_RayK<1>).flags;
              auVar88 = ZEXT1664(auVar5);
              uVar31 = vextractps_avx(auVar5,1);
              auVar27._8_4_ = 0x219392ef;
              auVar27._0_8_ = 0x219392ef219392ef;
              auVar27._12_4_ = 0x219392ef;
              uVar30 = vcmpps_avx512vl(auVar62,auVar27,5);
              auVar52 = vrcp14ps_avx512vl(auVar51);
              auVar53 = vfnmadd213ps_avx512vl(auVar51,auVar52,auVar57);
              auVar52 = vfmadd132ps_avx512vl(auVar53,auVar52,auVar52);
              fVar102 = (float)((uint)((byte)uVar30 & 1) * auVar52._0_4_);
              fVar103 = (float)((uint)((byte)(uVar30 >> 1) & 1) * auVar52._4_4_);
              fVar91 = (float)((uint)((byte)(uVar30 >> 2) & 1) * auVar52._8_4_);
              fVar104 = (float)((uint)((byte)(uVar30 >> 3) & 1) * auVar52._12_4_);
              auVar83._0_4_ = fVar102 * tNear.field_0._0_4_;
              auVar83._4_4_ = fVar103 * tNear.field_0._4_4_;
              auVar83._8_4_ = fVar91 * tNear.field_0._8_4_;
              auVar83._12_4_ = fVar104 * tNear.field_0._12_4_;
              local_1058 = vminps_avx512vl(auVar83,auVar57);
              auVar84._0_4_ = fVar102 * auVar75._0_4_;
              auVar84._4_4_ = fVar103 * auVar75._4_4_;
              auVar84._8_4_ = fVar91 * auVar75._8_4_;
              auVar84._12_4_ = fVar104 * auVar75._12_4_;
              local_1048 = vminps_avx512vl(auVar84,auVar57);
              auVar85._8_4_ = 0x7f800000;
              auVar85._0_8_ = 0x7f8000007f800000;
              auVar85._12_4_ = 0x7f800000;
              auVar52 = vblendmps_avx512vl(auVar85,local_1038);
              auVar79._0_4_ =
                   (uint)(bVar23 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar23 & 1) * 0x7f800000;
              bVar10 = (bool)(bVar23 >> 1 & 1);
              auVar79._4_4_ = (uint)bVar10 * auVar52._4_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)(bVar23 >> 2 & 1);
              auVar79._8_4_ = (uint)bVar10 * auVar52._8_4_ | (uint)!bVar10 * 0x7f800000;
              auVar79._12_4_ =
                   (uint)(bVar23 >> 3) * auVar52._12_4_ | (uint)!(bool)(bVar23 >> 3) * 0x7f800000;
              auVar52 = vshufps_avx(auVar79,auVar79,0xb1);
              auVar52 = vminps_avx(auVar52,auVar79);
              auVar53 = vshufpd_avx(auVar52,auVar52,1);
              auVar52 = vminps_avx(auVar53,auVar52);
              uVar20 = vcmpps_avx512vl(auVar79,auVar52,0);
              bVar34 = (byte)uVar20 & bVar23;
              do {
                auVar52 = auVar117._0_16_;
                bVar33 = bVar23;
                if (bVar34 != 0) {
                  bVar33 = bVar34;
                }
                uVar7 = 0;
                for (uVar35 = (uint)bVar33; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x80000000) {
                  uVar7 = uVar7 + 1;
                }
                h.geomID = *(uint *)((long)&local_f88 + (ulong)uVar7 * 4);
                pGVar8 = (local_1140->geometries).items[h.geomID].ptr;
                if ((pGVar8->mask & uVar31) == 0) {
                  bVar23 = ~(byte)(1 << (uVar7 & 0x1f)) & bVar23;
                }
                else {
                  pRVar9 = context->args;
                  auVar53 = auVar88._0_16_;
                  if (pRVar9->filter == (RTCFilterFunctionN)0x0) {
                    args.context = context->user;
                    if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                      uVar30 = (ulong)(uVar7 << 2);
                      fVar102 = *(float *)(local_1058 + uVar30);
                      fVar103 = *(float *)(local_1048 + uVar30);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1038 + uVar30);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_1028 + uVar30);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_1018 + uVar30);
                      (ray->Ng).field_0.field_0.z = *(float *)((long)local_1008 + uVar30);
                      ray->u = fVar102;
                      ray->v = fVar103;
                      ray->primID = *(uint *)((long)&local_10a8 + uVar30);
                      ray->geomID = h.geomID;
                      ray->instID[0] = (args.context)->instID[0];
                      ray->instPrimID[0] = (args.context)->instPrimID[0];
                      break;
                    }
                    local_1188 = auVar53;
                  }
                  else {
                    local_1188 = auVar53;
                    args.context = context->user;
                  }
                  uVar30 = (ulong)(uVar7 * 4);
                  h.Ng.field_0.field_0.x = *(float *)(local_1028 + uVar30);
                  h.Ng.field_0.field_0.y = *(float *)(local_1018 + uVar30);
                  h.Ng.field_0.field_0.z = *(float *)((long)local_1008 + uVar30);
                  h.u = *(float *)(local_1058 + uVar30);
                  h.v = *(float *)(local_1048 + uVar30);
                  h.primID = *(uint *)((long)&local_10a8 + uVar30);
                  h.instID[0] = (args.context)->instID[0];
                  h.instPrimID[0] = (args.context)->instPrimID[0];
                  (ray->super_RayK<1>).tfar = *(float *)(local_1038 + uVar30);
                  local_118c = -1;
                  args.valid = &local_118c;
                  args.geometryUserPtr = pGVar8->userPtr;
                  args.ray = (RTCRayN *)ray;
                  args.hit = (RTCHitN *)&h;
                  args.N = 1;
                  local_1178 = auVar87._0_16_;
                  local_1188 = auVar53;
                  if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01bdbfac:
                    auVar52 = auVar117._0_16_;
                    if ((pRVar9->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar9->filter)(&args);
                      auVar87 = ZEXT1664(local_1178);
                      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar118 = ZEXT1664(auVar53);
                      auVar52 = vxorps_avx512vl(auVar52,auVar52);
                      auVar117 = ZEXT1664(auVar52);
                      if (*args.valid == 0) goto LAB_01bdc075;
                    }
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    *(undefined4 *)(args.ray + 0x4c) = *(undefined4 *)(args.hit + 0x1c);
                    *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
                  }
                  else {
                    (*pGVar8->intersectionFilterN)(&args);
                    auVar87 = ZEXT1664(local_1178);
                    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar118 = ZEXT1664(auVar53);
                    auVar52 = vxorps_avx512vl(auVar52,auVar52);
                    auVar117 = ZEXT1664(auVar52);
                    if (*args.valid != 0) goto LAB_01bdbfac;
LAB_01bdc075:
                    (ray->super_RayK<1>).tfar = (float)local_1188._0_4_;
                  }
                  auVar6._0_4_ = (ray->super_RayK<1>).tfar;
                  auVar6._4_4_ = (ray->super_RayK<1>).mask;
                  auVar6._8_4_ = (ray->super_RayK<1>).id;
                  auVar6._12_4_ = (ray->super_RayK<1>).flags;
                  auVar88 = ZEXT1664(auVar6);
                  fVar102 = (ray->super_RayK<1>).tfar;
                  auVar28._4_4_ = fVar102;
                  auVar28._0_4_ = fVar102;
                  auVar28._8_4_ = fVar102;
                  auVar28._12_4_ = fVar102;
                  uVar20 = vcmpps_avx512vl(auVar87._0_16_,auVar28,2);
                  bVar23 = ~(byte)(1 << (uVar7 & 0x1f)) & bVar23 & (byte)uVar20;
                  uVar31 = vextractps_avx(auVar6,1);
                }
                if (bVar23 == 0) break;
                auVar86._8_4_ = 0x7f800000;
                auVar86._0_8_ = 0x7f8000007f800000;
                auVar86._12_4_ = 0x7f800000;
                auVar52 = vblendmps_avx512vl(auVar86,auVar87._0_16_);
                auVar80._0_4_ =
                     (uint)(bVar23 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar23 & 1) * 0x7f800000;
                bVar10 = (bool)(bVar23 >> 1 & 1);
                auVar80._4_4_ = (uint)bVar10 * auVar52._4_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(bVar23 >> 2 & 1);
                auVar80._8_4_ = (uint)bVar10 * auVar52._8_4_ | (uint)!bVar10 * 0x7f800000;
                auVar80._12_4_ =
                     (uint)(bVar23 >> 3) * auVar52._12_4_ | (uint)!(bool)(bVar23 >> 3) * 0x7f800000;
                auVar52 = vshufps_avx(auVar80,auVar80,0xb1);
                auVar52 = vminps_avx(auVar52,auVar80);
                auVar53 = vshufpd_avx(auVar52,auVar52,1);
                auVar52 = vminps_avx(auVar53,auVar52);
                uVar20 = vcmpps_avx512vl(auVar80,auVar52,0);
                bVar34 = (byte)uVar20 & bVar23;
              } while( true );
            }
          }
          auVar107 = ZEXT1664(local_fa8);
          auVar108 = ZEXT1664(local_fb8);
          auVar112 = ZEXT1664(local_fd8);
          auVar114 = ZEXT1664(local_fe8);
          auVar116 = ZEXT1664(local_ff8);
          lVar45 = local_1160;
          lVar47 = local_1168;
          fVar91 = local_f98;
          fVar102 = fStack_f94;
          fVar103 = fStack_f90;
          fVar104 = fStack_f8c;
          fVar81 = local_fc8;
          fVar109 = fStack_fc4;
          fVar110 = fStack_fc0;
          fVar111 = fStack_fbc;
        }
        fVar2 = (ray->super_RayK<1>).tfar;
        auVar87 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
        auVar88 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
      }
      goto LAB_01bdb380;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }